

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PropertySpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PropertySpecSyntax,slang::syntax::TimingControlSyntax*&,slang::syntax::DisableIffSyntax*&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,TimingControlSyntax **args,DisableIffSyntax **args_1,
          PropertyExprSyntax *args_2)

{
  PropertySpecSyntax *this_00;
  
  this_00 = (PropertySpecSyntax *)allocate(this,0x28,8);
  slang::syntax::PropertySpecSyntax::PropertySpecSyntax(this_00,*args,*args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }